

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<int_const&,int_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
               (string *s,char *fmt,int *v,int *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  long lVar1;
  ulong uVar2;
  char *in_RCX;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_RBX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffd70;
  string *psVar3;
  char **in_stack_fffffffffffffd78;
  char **in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  string local_260 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  int *in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdbc;
  string *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  string *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  LogLevel in_stack_fffffffffffffe04;
  string local_90 [32];
  undefined4 local_70;
  undefined1 local_5b;
  byte local_5a;
  byte local_59;
  string local_58 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  copyToFormatString(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  lVar1 = std::__cxx11::string::find((char)local_58,0x2a);
  local_59 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_58,0x73);
  local_5a = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_58,100);
  local_5b = lVar1 != -1;
  if ((local_59 & 1) == 0) {
    if ((bool)local_5b) {
      psVar3 = local_58;
      uVar2 = std::__cxx11::string::find((char)psVar3,100);
      IntegerFormatTrait<int>::fmt();
      std::__cxx11::string::replace((ulong)psVar3,uVar2,(char *)0x1);
      std::__cxx11::string::c_str();
      formatOne<int_const&>(in_stack_fffffffffffffd88,(int *)in_stack_fffffffffffffd80);
      std::__cxx11::string::operator+=((string *)in_RDI,local_90);
      std::__cxx11::string::~string(local_90);
    }
    else if ((local_5a & 1) == 0) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffe04,(char *)in_stack_fffffffffffffdf8,
                 in_stack_fffffffffffffdf4,(char *)in_stack_fffffffffffffde8);
      }
      std::__cxx11::string::c_str();
      formatOne<int_const&>(in_stack_fffffffffffffd88,(int *)in_stack_fffffffffffffd80);
      std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xfffffffffffffd80);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd80);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffde8);
      std::ostream::operator<<(&stack0xfffffffffffffdf8,*(int *)in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xfffffffffffffdc8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc8);
      std::__cxx11::string::~string(local_260);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffde8);
    }
    stringPrintfRecursive<int_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_RDI,
               unaff_RBX);
    local_70 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<int_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               in_stack_fffffffffffffde0,in_stack_fffffffffffffde8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffdf8);
    local_70 = 1;
  }
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}